

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void whereLoopOutputAdjust(WhereClause *pWC,WhereLoop *pLoop,LogEst nRow)

{
  ulong uVar1;
  ulong uVar2;
  WhereTerm *pWVar3;
  undefined4 in_EAX;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  undefined6 in_register_00000012;
  int iVar8;
  WhereTerm *pWVar9;
  bool bVar10;
  int k;
  undefined4 local_34;
  
  _k = CONCAT44((int)CONCAT62(in_register_00000012,nRow),in_EAX);
  uVar1 = pLoop->maskSelf;
  uVar2 = pLoop->prereq;
  iVar8 = pWC->nTerm;
  pWVar9 = pWC->a;
  uVar4 = 0;
  do {
    if ((iVar8 < 1) || ((pWVar9->wtFlags & 2) != 0)) {
      if ((int)((int)(short)local_34 - uVar4) < (int)pLoop->nOut) {
        pLoop->nOut = (LogEst)((int)(short)local_34 - uVar4);
      }
      return;
    }
    if (((pLoop->maskSelf & pWVar9->prereqAll) != 0) &&
       ((pWVar9->prereqAll & ~(uVar1 | uVar2)) == 0)) {
      uVar7 = (ulong)pLoop->nLTerm;
      while (bVar10 = uVar7 != 0, uVar7 = uVar7 - 1, bVar10) {
        pWVar3 = pLoop->aLTerm[uVar7];
        if ((pWVar3 != (WhereTerm *)0x0) &&
           ((pWVar3 == pWVar9 ||
            ((-1 < (long)pWVar3->iParent && (pWC->a + pWVar3->iParent == pWVar9))))))
        goto LAB_0017a214;
      }
      if (pWVar9->truthProb < 1) {
        pLoop->nOut = pLoop->nOut + pWVar9->truthProb;
      }
      else {
        pLoop->nOut = pLoop->nOut + -1;
        if ((pWVar9->eOperator & 0x82) != 0) {
          iVar5 = sqlite3ExprIsInteger(pWVar9->pExpr->pRight,&k);
          uVar6 = 0x14;
          if (k + 1U < 3) {
            uVar6 = 10;
          }
          if (iVar5 == 0) {
            uVar6 = 0x14;
          }
          _k = CONCAT44(local_34,uVar6);
          if (uVar4 < uVar6) {
            uVar4 = uVar6;
          }
        }
      }
    }
LAB_0017a214:
    iVar8 = iVar8 + -1;
    pWVar9 = pWVar9 + 1;
  } while( true );
}

Assistant:

static void whereLoopOutputAdjust(
  WhereClause *pWC,      /* The WHERE clause */
  WhereLoop *pLoop,      /* The loop to adjust downward */
  LogEst nRow            /* Number of rows in the entire table */
){
  WhereTerm *pTerm, *pX;
  Bitmask notAllowed = ~(pLoop->prereq|pLoop->maskSelf);
  int i, j, k;
  LogEst iReduce = 0;    /* pLoop->nOut should not exceed nRow-iReduce */

  assert( (pLoop->wsFlags & WHERE_AUTO_INDEX)==0 );
  for(i=pWC->nTerm, pTerm=pWC->a; i>0; i--, pTerm++){
    if( (pTerm->wtFlags & TERM_VIRTUAL)!=0 ) break;
    if( (pTerm->prereqAll & pLoop->maskSelf)==0 ) continue;
    if( (pTerm->prereqAll & notAllowed)!=0 ) continue;
    for(j=pLoop->nLTerm-1; j>=0; j--){
      pX = pLoop->aLTerm[j];
      if( pX==0 ) continue;
      if( pX==pTerm ) break;
      if( pX->iParent>=0 && (&pWC->a[pX->iParent])==pTerm ) break;
    }
    if( j<0 ){
      if( pTerm->truthProb<=0 ){
        /* If a truth probability is specified using the likelihood() hints,
        ** then use the probability provided by the application. */
        pLoop->nOut += pTerm->truthProb;
      }else{
        /* In the absence of explicit truth probabilities, use heuristics to
        ** guess a reasonable truth probability. */
        pLoop->nOut--;
        if( pTerm->eOperator&(WO_EQ|WO_IS) ){
          Expr *pRight = pTerm->pExpr->pRight;
          testcase( pTerm->pExpr->op==TK_IS );
          if( sqlite3ExprIsInteger(pRight, &k) && k>=(-1) && k<=1 ){
            k = 10;
          }else{
            k = 20;
          }
          if( iReduce<k ) iReduce = k;
        }
      }
    }
  }
  if( pLoop->nOut > nRow-iReduce )  pLoop->nOut = nRow - iReduce;
}